

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O3

bool __thiscall FConfigFile::ReadConfig(FConfigFile *this,void *file)

{
  char cVar1;
  FConfigFile *pFVar2;
  char *pcVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar5;
  FConfigFile *pFVar6;
  undefined4 extraout_var_00;
  FConfigFile *pFVar7;
  FConfigFile *pFVar8;
  char *value;
  FConfigFile *__s;
  char readbuf [4096];
  undefined1 local_1040 [8];
  char local_1038 [4104];
  
  ClearConfig(this);
  iVar4 = (*this->_vptr_FConfigFile[3])(this,local_1038,0x1000,file);
  if (CONCAT44(extraout_var,iVar4) != 0) {
    local_1040 = (undefined1  [8])0x0;
    do {
      __s = (FConfigFile *)(local_1040 + 7);
      do {
        pFVar8 = __s;
        __s = (FConfigFile *)((long)&pFVar8->_vptr_FConfigFile + 1);
        cVar1 = *(char *)((long)&pFVar8->_vptr_FConfigFile + 1);
        if (cVar1 == '\0') break;
      } while (cVar1 < '!');
      if ((cVar1 != '#') &&
         ((pcVar3 = (char *)((long)&pFVar8->_vptr_FConfigFile + 2), cVar1 != '/' || (*pcVar3 != '/')
          ))) {
        sVar5 = strlen((char *)__s);
        pFVar8 = (FConfigFile *)((long)&pFVar8->_vptr_FConfigFile + sVar5);
        do {
          pFVar7 = pFVar8;
          if (pFVar7 <= __s) {
            *(undefined1 *)((long)&pFVar7->_vptr_FConfigFile + 1) = 0;
            goto LAB_004afb44;
          }
          cVar1 = *(char *)&pFVar7->_vptr_FConfigFile;
          pFVar8 = (FConfigFile *)((long)&pFVar7[-1].PathName.Chars + 7);
        } while (cVar1 < '!');
        *(undefined1 *)((long)&pFVar7->_vptr_FConfigFile + 1) = 0;
        if (*(char *)&__s->_vptr_FConfigFile == '[') {
          if (cVar1 == ']') {
            *(undefined1 *)&pFVar7->_vptr_FConfigFile = 0;
          }
          local_1040 = (undefined1  [8])NewConfigSection(this,pcVar3);
        }
        else {
          if (local_1040 == (undefined1  [8])0x0) {
            return false;
          }
          pFVar8 = __s;
          pFVar6 = (FConfigFile *)strchr((char *)__s,0x3d);
          pFVar7 = pFVar6;
          if (__s < pFVar6) {
            do {
              pFVar2 = pFVar7;
              pFVar7 = (FConfigFile *)((long)&pFVar2[-1].PathName.Chars + 7);
              if (pFVar7 <= __s) break;
              pFVar8 = (FConfigFile *)(ulong)(uint)(int)*(char *)&pFVar7->_vptr_FConfigFile;
              iVar4 = isspace((int)*(char *)&pFVar7->_vptr_FConfigFile);
            } while (iVar4 != 0);
            *(char *)&pFVar2->_vptr_FConfigFile = '\0';
            pcVar3 = (char *)((long)&pFVar6->_vptr_FConfigFile + 1);
            do {
              value = pcVar3;
              cVar1 = *value;
              if (cVar1 == '\0') {
                value[-1] = '\0';
                goto LAB_004afb2f;
              }
              pFVar8 = (FConfigFile *)(ulong)(uint)(int)cVar1;
              iVar4 = isspace((int)cVar1);
              pcVar3 = value + 1;
            } while (iVar4 != 0);
            value[-1] = '\0';
            if ((((cVar1 == '<') && (value[1] == '<')) && (value[2] == '<')) && (value[3] != '\0'))
            {
              ReadMultiLineValue(this,file,(FConfigSection *)local_1040,(char *)__s,value + 3);
            }
            else {
LAB_004afb2f:
              NewConfigEntry(pFVar8,(FConfigSection *)local_1040,(char *)__s,value);
            }
          }
        }
      }
LAB_004afb44:
      iVar4 = (*this->_vptr_FConfigFile[3])(this,local_1038,0x1000,file);
    } while (CONCAT44(extraout_var_00,iVar4) != 0);
  }
  return true;
}

Assistant:

bool FConfigFile::ReadConfig (void *file)
{
	char readbuf[READBUFFERSIZE];
	FConfigSection *section = NULL;
	ClearConfig ();

	while (ReadLine (readbuf, READBUFFERSIZE, file) != NULL)
	{
		char *start = readbuf;
		char *equalpt;
		char *endpt;

		// Remove white space at start of line
		while (*start && *start <= ' ')
		{
			start++;
		}
		// Remove comment lines
		if (*start == '#' || (start[0] == '/' && start[1] == '/'))
		{
			continue;
		}
		// Remove white space at end of line
		endpt = start + strlen (start) - 1;
		while (endpt > start && *endpt <= ' ')
		{
			endpt--;
		}
		endpt[1] = 0;
		if (endpt <= start)
			continue;	// Nothing here

		if (*start == '[')
		{ // Section header
			if (*endpt == ']')
				*endpt = 0;
			section = NewConfigSection (start+1);
		}
		else if (section == NULL)
		{
			return false;
		}
		else
		{ // Should be key=value
			equalpt = strchr (start, '=');
			if (equalpt != NULL && equalpt > start)
			{
				// Remove white space in front of =
				char *whiteprobe = equalpt - 1;
				while (whiteprobe > start && isspace(*whiteprobe))
				{
					whiteprobe--;
				}
				whiteprobe[1] = 0;
				// Remove white space after =
				whiteprobe = equalpt + 1;
				while (*whiteprobe && isspace(*whiteprobe))
				{
					whiteprobe++;
				}
				*(whiteprobe - 1) = 0;
				// Check for multi-line value
				if (whiteprobe[0] == '<' && whiteprobe[1] == '<' && whiteprobe[2] == '<' && whiteprobe[3] != '\0')
				{
					ReadMultiLineValue (file, section, start, whiteprobe + 3);
				}
				else
				{
					NewConfigEntry (section, start, whiteprobe);
				}
			}
		}
	}
	return true;
}